

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintC::pushPrototypeInputs(PrintC *this,FuncProto *proto)

{
  uint uVar1;
  long *plVar2;
  undefined8 uVar3;
  uint4 *puVar4;
  int iVar5;
  uint uVar6;
  char *__end;
  string local_88;
  uint4 *local_68;
  FuncProto *local_60;
  Atom local_58;
  undefined4 extraout_var;
  
  uVar1 = (*proto->store->_vptr_ProtoStore[5])();
  if (uVar1 == 0) {
    if ((proto->flags & 1) == 0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"void","");
      local_58.type = syntax;
      local_58.highlight = keyword_color;
      local_58.name = &local_88;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
      goto LAB_003001a8;
    }
    puVar4 = &proto->flags;
  }
  else {
    if (1 < (int)uVar1) {
      iVar5 = uVar1 - 1;
      do {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    if ((proto->flags & 1) != 0) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&comma,(PcodeOp *)0x0);
    }
    puVar4 = &proto->flags;
    if (0 < (int)uVar1) {
      uVar6 = 0;
      local_68 = &proto->flags;
      local_60 = proto;
      do {
        iVar5 = (*local_60->store->_vptr_ProtoStore[6])(local_60->store,(ulong)uVar6);
        plVar2 = (long *)CONCAT44(extraout_var,iVar5);
        uVar3 = (**(code **)(*plVar2 + 0x18))(plVar2);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,uVar3,1);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"","");
        local_58.type = blanktoken;
        local_58.highlight = no_color;
        local_58.name = &local_88;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        uVar3 = (**(code **)(*plVar2 + 0x18))(plVar2);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,uVar3);
        uVar6 = uVar6 + 1;
        puVar4 = local_68;
      } while (uVar1 != uVar6);
    }
  }
  if ((*puVar4 & 1) == 0) {
    return;
  }
  if (uVar1 == 0) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    local_58.type = blanktoken;
    local_58.highlight = no_color;
    local_58.name = &local_88;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"...","");
    local_58.type = syntax;
    local_58.highlight = no_color;
    local_58.name = &local_88;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
  }
LAB_003001a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PrintC::pushPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();

  if ((sz == 0)&&(!proto->isDotdotdot()))
    pushAtom(Atom("void",syntax,EmitXml::keyword_color));
  else {
    for(int4 i=0;i<sz-1;++i)
      pushOp(&comma,(const PcodeOp *)0); // Print a comma for each parameter (above 1)
    if (proto->isDotdotdot()&&(sz!=0)) // Print comma for dotdotdot (if it is not by itself)
      pushOp(&comma,(const PcodeOp *)0);
    for(int4 i=0;i<sz;++i) {
      ProtoParameter *param = proto->getParam(i);
      pushTypeStart(param->getType(),true);
      pushAtom(Atom("",blanktoken,EmitXml::no_color));
      pushTypeEnd(param->getType());
    }
    if (proto->isDotdotdot()) {
      if (sz != 0)
	pushAtom(Atom("...",syntax,EmitXml::no_color));
      else {
	// In ANSI C, a prototype with empty parens means the parameters are unspecified (not void)
	// In C++, empty parens mean void, we use the ANSI C convention
	pushAtom(Atom("",blanktoken,EmitXml::no_color)); // An empty list of parameters
      }
    }
  }
}